

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaOutputFile::setYCRounding(RgbaOutputFile *this,uint roundY,uint roundC)

{
  pthread_mutex_t *__mutex;
  ToYca *pTVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->_toYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    return;
  }
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    pTVar1 = this->_toYca;
    pTVar1->_roundY = roundY;
    pTVar1->_roundC = roundC;
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void
RgbaOutputFile::setYCRounding (unsigned int roundY, unsigned int roundC)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->setYCRounding (roundY, roundC);
    }
}